

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParserManager.cpp
# Opt level: O1

void __thiscall
OpenMD::SectionParserManager::push_back(SectionParserManager *this,SectionParser *sp)

{
  SectionParserContextList *pSVar1;
  size_t *psVar2;
  iterator iVar3;
  ostream *poVar4;
  _List_node_base *p_Var5;
  int iVar6;
  
  iVar3 = findSectionParser(this,&sp->sectionName_);
  pSVar1 = &this->sectionParsers_;
  if (iVar3._M_node != (_List_node_base *)pSVar1) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(sp->sectionName_)._M_dataplus._M_p,
                        (sp->sectionName_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," section parser already exists",0x1e)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    return;
  }
  if ((pSVar1->
      super__List_base<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>)
      ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)pSVar1) {
    iVar6 = this->beginPriority_;
  }
  else {
    iVar6 = this->priorityDifference_ +
            *(int *)&(this->sectionParsers_).
                     super__List_base<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
                     ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
  }
  p_Var5 = (_List_node_base *)operator_new(0x40);
  *(int *)&p_Var5[1]._M_next = iVar6;
  p_Var5[1]._M_prev = (_List_node_base *)sp;
  *(undefined4 *)&p_Var5[2]._M_next = 0;
  p_Var5[2]._M_prev = (_List_node_base *)0x0;
  p_Var5[3]._M_next = (_List_node_base *)0x0;
  *(undefined1 *)&p_Var5[3]._M_prev = 0;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  psVar2 = &(this->sectionParsers_).
            super__List_base<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
            ._M_impl._M_node._M_size;
  *psVar2 = *psVar2 + 1;
  return;
}

Assistant:

void SectionParserManager::push_back(SectionParser* sp) {
    SectionParserManager::iterator i;
    i = findSectionParser(sp->getSectionName());
    if (i != sectionParsers_.end()) {
      std::cerr << sp->getSectionName() << " section parser already exists"
                << std::endl;
      return;
    }

    SectionParserContext context;
    if (sectionParsers_.empty()) {
      context.priority = beginPriority_;
    } else {
      context.priority = sectionParsers_.back().priority + priorityDifference_;
    }

    context.sectionParser = sp;
    context.lineNo        = 0;
    context.offset        = 0;
    context.isActive      = false;

    sectionParsers_.push_back(context);
  }